

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::QuadrifyPart
               (IfcVector2 *pmin,IfcVector2 *pmax,XYSortedField *field,
               vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
               *bbs,vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  _Base_ptr p_Var5;
  XYSortedField *field_00;
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  *bbs_00;
  _Base_ptr p_Var6;
  pointer ppVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  aiVector2t<double> local_70;
  double local_60;
  double local_58;
  XYSortedField *local_50;
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  *local_48;
  IfcVector2 local_40;
  
  dVar8 = pmin->x;
  local_58 = pmax->x;
  if ((dVar8 - local_58 == 0.0) && (!NAN(dVar8 - local_58))) {
    return;
  }
  local_60 = pmin->y;
  dVar12 = pmax->y;
  if ((local_60 - dVar12 == 0.0) && (!NAN(local_60 - dVar12))) {
    return;
  }
  p_Var1 = &(field->_M_t)._M_impl.super__Rb_tree_header;
  ppVar7 = (bbs->
           super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = field;
  local_48 = bbs;
  for (p_Var6 = (field->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    p_Var5 = p_Var6[1]._M_left;
    dVar11 = ppVar7[(long)p_Var5].first.x;
    if (local_58 <= dVar11) break;
    dVar10 = ppVar7[(long)p_Var5].second.x;
    if (((dVar8 < dVar10) && (local_60 < ppVar7[(long)p_Var5].second.y)) &&
       (pdVar2 = &ppVar7[(long)p_Var5].first.y, *pdVar2 <= dVar12 && dVar12 != *pdVar2)) {
      if (dVar11 <= dVar8) {
        dVar11 = dVar8;
      }
      if ((dVar11 - dVar8 != 0.0) || (dVar12 = local_60, NAN(dVar11 - dVar8))) {
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back(out,pmin);
        local_70.x = pmin->x;
        local_70.y = pmax->y;
        std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
        emplace_back<aiVector2t<double>>
                  ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
        local_70.y = pmax->y;
        local_70.x = dVar11;
        std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
        emplace_back<aiVector2t<double>>
                  ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
        local_70.y = pmin->y;
        local_70.x = dVar11;
        std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
        emplace_back<aiVector2t<double>>
                  ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
        dVar12 = pmin->y;
      }
      bbs_00 = local_48;
      if (local_58 <= dVar10) {
        dVar10 = local_58;
      }
      local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
      goto LAB_004e27cb;
    }
  }
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back(out,pmin);
  local_70.x = pmin->x;
  local_70.y = pmax->y;
  std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
  emplace_back<aiVector2t<double>>
            ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back(out,pmax);
  local_70.x = pmax->x;
  local_70.y = pmin->y;
LAB_004e26ce:
  std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
  emplace_back<aiVector2t<double>>
            ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
  return;
LAB_004e27cb:
  field_00 = local_50;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) goto LAB_004e288e;
  ppVar7 = (bbs_00->
           super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (dVar11 < ppVar7[(long)p_Var6[1]._M_left].first.x) goto LAB_004e288e;
  ppVar7 = ppVar7 + (long)p_Var6[1]._M_left;
  dVar8 = (ppVar7->first).y;
  dVar3 = pmax->y;
  if (dVar3 <= dVar8) goto LAB_004e288e;
  dVar4 = (ppVar7->second).y;
  local_58 = dVar12;
  if (dVar12 < dVar4) {
    dVar9 = pmin->y;
    if (pmin->y <= dVar8) {
      dVar9 = dVar8;
    }
    local_58 = dVar3;
    if (dVar4 <= dVar3) {
      local_58 = dVar4;
    }
    local_60 = (double)CONCAT44(local_60._4_4_,(int)CONCAT71((int7)((ulong)ppVar7 >> 8),1));
    if (dVar12 < dVar9) {
      local_70.x = dVar11;
      local_70.y = dVar12;
      local_40.x = dVar10;
      local_40.y = dVar9;
      QuadrifyPart(&local_70,&local_40,local_50,bbs_00,out);
    }
  }
  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  dVar12 = local_58;
  goto LAB_004e27cb;
LAB_004e288e:
  if (((ulong)local_60 & 1) != 0) {
    if (dVar12 < pmax->y) {
      local_70.x = dVar11;
      local_70.y = dVar12;
      local_40.x = dVar10;
      local_40.y = pmax->y;
      QuadrifyPart(&local_70,&local_40,local_50,bbs_00,out);
    }
    dVar8 = pmax->x - dVar10;
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      return;
    }
    local_70.y = pmin->y;
    local_70.x = dVar10;
    QuadrifyPart(&local_70,pmax,field_00,bbs_00,out);
    return;
  }
  local_70.y = pmin->y;
  local_70.x = dVar11;
  std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
  emplace_back<aiVector2t<double>>
            ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
  local_70.y = pmax->y;
  local_70.x = dVar11;
  std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
  emplace_back<aiVector2t<double>>
            ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
  local_70.y = pmax->y;
  local_70.x = dVar10;
  std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
  emplace_back<aiVector2t<double>>
            ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,&local_70);
  local_70.y = pmin->y;
  local_70.x = dVar10;
  goto LAB_004e26ce;
}

Assistant:

void QuadrifyPart(const IfcVector2& pmin, const IfcVector2& pmax, XYSortedField& field,
    const std::vector< BoundingBox >& bbs,
    std::vector<IfcVector2>& out)
{
    if (!(pmin.x-pmax.x) || !(pmin.y-pmax.y)) {
        return;
    }

    IfcFloat xs = 1e10, xe = 1e10;
    bool found = false;

    // Search along the x-axis until we find an opening
    XYSortedField::iterator start = field.begin();
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if(bb.first.x >= pmax.x) {
            break;
        }

        if (bb.second.x > pmin.x && bb.second.y > pmin.y && bb.first.y < pmax.y) {
            xs = bb.first.x;
            xe = bb.second.x;
            found = true;
            break;
        }
    }

    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(pmax);
        out.push_back(IfcVector2(pmax.x,pmin.y));
        return;
    }

    xs = std::max(pmin.x,xs);
    xe = std::min(pmax.x,xe);

    // see if there's an offset to fill at the top of our quad
    if (xs - pmin.x) {
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xs,pmin.y));
    }

    // search along the y-axis for all openings that overlap xs and our quad
    IfcFloat ylast = pmin.y;
    found = false;
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if (bb.first.x > xs || bb.first.y >= pmax.y) {
            break;
        }

        if (bb.second.y > ylast) {

            found = true;
            const IfcFloat ys = std::max(bb.first.y,pmin.y), ye = std::min(bb.second.y,pmax.y);
            if (ys - ylast > 0.0f) {
                QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,ys) ,field,bbs,out);
            }

            // the following are the window vertices

            /*wnd.push_back(IfcVector2(xs,ys));
            wnd.push_back(IfcVector2(xs,ye));
            wnd.push_back(IfcVector2(xe,ye));
            wnd.push_back(IfcVector2(xe,ys));*/
            ylast = ye;
        }
    }
    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(IfcVector2(xs,pmin.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xe,pmax.y));
        out.push_back(IfcVector2(xe,pmin.y));
        return;
    }
    if (ylast < pmax.y) {
        QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,pmax.y) ,field,bbs,out);
    }

    // now for the whole rest
    if (pmax.x-xe) {
        QuadrifyPart(IfcVector2(xe,pmin.y), pmax ,field,bbs,out);
    }
}